

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O3

void __thiscall
pstore::
error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
::
move_construct<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short>>
          (error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
           *this,error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>_>
                 *rhs)

{
  error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
  eVar1;
  error_code *peVar2;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>
  *ptVar3;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>
  *ptVar4;
  error_code eVar5;
  
  eVar1 = (error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
           )rhs->has_error_;
  this[0x10] = eVar1;
  if (eVar1 == (error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
                )0x1) {
    peVar2 = error_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>&,std::error_code>
                       ((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>_>
                         *)this);
    eVar5 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>_>
            ::get_error(rhs);
    peVar2->_M_value = eVar5._M_value;
    peVar2->_M_cat = eVar5._M_cat;
  }
  else {
    ptVar3 = value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
                       ((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>_>
                         *)this);
    ptVar4 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short>>
             ::
             value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short>>&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short>>
                       (rhs);
    (ptVar3->
    super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>
    ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
         = (ulong)(ptVar4->
                  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>
                  ).super__Tuple_impl<1UL,_unsigned_short>.
                  super__Head_base<1UL,_unsigned_short,_false>._M_head_impl;
    (ptVar3->
    super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>
    ).
    super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
    ._M_head_impl._M_data =
         (ptVar4->
         super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>
         ).
         super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
         ._M_head_impl._M_data;
  }
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }